

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O1

Id __thiscall
dxil_spv::SPIRVModule::Impl::build_coop_mat_fp8_to_fp16
          (Impl *this,SPIRVModule *module,Id *ids,uint32_t id_count)

{
  Builder *this_00;
  Vector<std::unique_ptr<Instruction>_> *pVVar1;
  pointer *ppCVar2;
  Id returnType;
  uint uVar3;
  pointer pCVar4;
  pointer pCVar5;
  iterator iVar6;
  iterator __position;
  Function *pFVar7;
  Impl *pIVar8;
  Block *pBVar9;
  Block *elseBlock;
  Id IVar10;
  Id IVar11;
  Instruction *pIVar12;
  Instruction *pIVar13;
  Instruction *pIVar14;
  Instruction *pIVar15;
  Id *pIVar16;
  bool bVar17;
  Block *entry;
  Vector<Id> local_b8;
  Function *local_a0;
  Impl *local_98;
  Id local_8c;
  Id local_88;
  uint local_84;
  Block *local_80;
  Id local_74;
  Block *local_70;
  Block *local_68;
  Vector<std::unique_ptr<Instruction>_> *local_60;
  Instruction *local_58;
  Block *local_50;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_48;
  
  IVar10 = 0;
  if (id_count == 2) {
    IVar11 = *ids;
    returnType = ids[1];
    pCVar4 = (this->coop_mat_conv_ids).
             super__Vector_base<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar5 = (this->coop_mat_conv_ids).
             super__Vector_base<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar17 = pCVar4 == pCVar5;
    if (!bVar17) {
      pIVar16 = &pCVar4->func_id;
      do {
        if (pIVar16[1] == CoopMatFP8toFP16 &&
            (pIVar16[-1] == returnType && ((CoopMatConvOp *)(pIVar16 + -2))->input_type == IVar11))
        {
          IVar10 = *pIVar16;
          break;
        }
        bVar17 = (pointer)(pIVar16 + 2) == pCVar5;
        pIVar16 = pIVar16 + 4;
      } while (!bVar17);
    }
    if (bVar17) {
      this_00 = &this->builder;
      local_50 = (this->builder).buildPoint;
      local_68 = (Block *)0x0;
      local_98 = this;
      local_88 = spv::Builder::makeIntegerType(this_00,0x20,false);
      local_74 = spv::Builder::makeBoolType(this_00);
      IVar10 = spv::Builder::makePointer(this_00,StorageClassFunction,IVar11);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(4);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + 1;
      *local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start = IVar10;
      local_48.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_a0 = spv::Builder::makeFunctionEntry
                           (this_00,DecorationMax,returnType,"CoopMatFP8toFP16",&local_b8,&local_48,
                            &local_68);
      std::
      vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
      ::~vector(&local_48);
      if (local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (Id *)0x0) {
        free_in_thread(local_b8.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      }
      local_84 = spv::Builder::createVariable(this_00,StorageClassFunction,returnType,"coop_output")
      ;
      local_58 = spv::Builder::addInstruction(this_00,local_88,OpCooperativeMatrixLengthKHR);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_b8.
                             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar11);
      iVar6._M_current =
           (local_58->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (local_58->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &local_58->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current = IVar11;
        (local_58->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      pIVar8 = local_98;
      local_8c = IVar11;
      local_80 = (Block *)allocate_in_thread(0x78);
      IVar10 = (pIVar8->builder).uniqueId + 1;
      (pIVar8->builder).uniqueId = IVar10;
      local_80->_vptr_Block = (_func_int **)&PTR__Block_001f8cc8;
      pVVar1 = &local_80->instructions;
      (local_80->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_80->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_80->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_80->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_80->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_80->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_80->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_80->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_80->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_80->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_80->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_80->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_80->parent = local_a0;
      local_80->unreachable = false;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
      *(undefined ***)
       local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start = &PTR__Instruction_001f81e0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[2] = IVar10;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[3] = 0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[4] = 0xf8;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[6] = 0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[7] = 0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[8] = 0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[9] = 0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[10] = 0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[0xb] = 0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[0xc] = 0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[0xd] = 0;
      local_60 = pVVar1;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)pVVar1,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_b8);
      if (local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_b8.
                              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_start + 8))();
      }
      pFVar7 = local_a0;
      ((local_80->instructions).
       super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_80;
      spv::Module::mapInstruction
                (local_a0->parent,
                 (local_80->instructions).
                 super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                 super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
      local_70 = (Block *)allocate_in_thread(0x78);
      IVar10 = (pIVar8->builder).uniqueId + 1;
      (pIVar8->builder).uniqueId = IVar10;
      local_70->_vptr_Block = (_func_int **)&PTR__Block_001f8cc8;
      pVVar1 = &local_70->instructions;
      (local_70->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_70->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_70->instructions).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_70->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_70->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_70->predecessors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_70->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_70->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_70->successors).
      super__Vector_base<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_70->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_70->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_70->localVariables).
      super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_70->parent = pFVar7;
      local_70->unreachable = false;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(0x38);
      *(undefined ***)
       local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start = &PTR__Instruction_001f81e0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[2] = IVar10;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[3] = 0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[4] = 0xf8;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[6] = 0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[7] = 0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[8] = 0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[9] = 0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[10] = 0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[0xb] = 0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[0xc] = 0;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[0xd] = 0;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)pVVar1,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_b8);
      if (local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_b8.
                              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_start + 8))();
      }
      ((local_70->instructions).
       super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
       super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
       super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = local_70;
      spv::Module::mapInstruction
                (local_a0->parent,
                 (local_70->instructions).
                 super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
                 super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
      pBVar9 = local_80;
      spv::Builder::createBranch(this_00,local_80);
      IVar10 = local_88;
      (local_98->builder).buildPoint = pBVar9;
      pIVar12 = spv::Builder::addInstruction(this_00,local_88,OpPhi);
      pIVar13 = spv::Builder::addInstruction(this_00,IVar10,OpIAdd);
      uVar3 = pIVar12->resultId;
      iVar6._M_current =
           (pIVar13->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = uVar3;
      if (iVar6._M_current ==
          (pIVar13->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar13->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current = uVar3;
        (pIVar13->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      IVar10 = spv::Builder::makeIntegerType(this_00,0x20,false);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           spv::Builder::makeIntConstant(this_00,IVar10,1,false);
      iVar6._M_current =
           (pIVar13->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar13->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar13->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar13->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      IVar10 = spv::Builder::makeIntegerType(this_00,0x20,false);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           spv::Builder::makeIntConstant(this_00,IVar10,0,false);
      iVar6._M_current =
           (pIVar12->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar12->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar12->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           *(uint *)((long)(((local_68->instructions).
                             super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                           ._M_t + 8);
      iVar6._M_current =
           (pIVar12->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar12->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar12->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar13->resultId;
      iVar6._M_current =
           (pIVar12->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar12->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar12->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           *(uint *)((long)(((local_60->
                             super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->_M_t).
                           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                    + 8);
      iVar6._M_current =
           (pIVar12->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar12->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar12->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      IVar10 = spv::Builder::makeIntegerType(this_00,8,false);
      IVar10 = spv::Builder::makePointer(this_00,StorageClassFunction,IVar10);
      pIVar14 = spv::Builder::addInstruction(this_00,IVar10,OpInBoundsAccessChain);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           (*(local_a0->parameterInstructions).
             super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start)->resultId;
      iVar6._M_current =
           (pIVar14->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar14->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar14->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar14->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar12->resultId;
      iVar6._M_current =
           (pIVar14->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar14->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar14->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar14->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      IVar10 = spv::Builder::makeIntegerType(this_00,8,false);
      pIVar15 = spv::Builder::addInstruction(this_00,IVar10,OpLoad);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar14->resultId;
      iVar6._M_current =
           (pIVar15->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar15->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar15->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar15->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      IVar10 = spv::Builder::makeIntegerType(this_00,0x10,true);
      pIVar14 = spv::Builder::addInstruction(this_00,IVar10,OpSConvert);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar15->resultId;
      iVar6._M_current =
           (pIVar14->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar14->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar14->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar14->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      IVar10 = spv::Builder::makeIntegerType(this_00,0x10,true);
      pIVar15 = spv::Builder::addInstruction(this_00,IVar10,OpShiftLeftLogical);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar14->resultId;
      iVar6._M_current =
           (pIVar15->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar15->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar15->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar15->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      IVar10 = spv::Builder::makeIntegerType(this_00,0x10,true);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           spv::Builder::makeIntConstant(this_00,IVar10,7,false);
      iVar6._M_current =
           (pIVar15->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar15->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar15->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar15->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      IVar10 = spv::Builder::makeIntegerType(this_00,0x10,true);
      pIVar14 = spv::Builder::addInstruction(this_00,IVar10,OpBitwiseAnd);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar15->resultId;
      iVar6._M_current =
           (pIVar14->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar14->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar14->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar14->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      IVar10 = spv::Builder::makeIntegerType(this_00,0x10,true);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ =
           spv::Builder::makeIntConstant(this_00,IVar10,0xffffbfff,false);
      iVar6._M_current =
           (pIVar14->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar14->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar14->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar14->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      IVar10 = spv::Builder::makeFloatType(this_00,0x10);
      pIVar15 = spv::Builder::addInstruction(this_00,IVar10,OpBitcast);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar14->resultId;
      iVar6._M_current =
           (pIVar15->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar15->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar15->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar15->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      IVar10 = spv::Builder::makeFloatType(this_00,0x10);
      IVar10 = spv::Builder::makePointer(this_00,StorageClassFunction,IVar10);
      pIVar14 = spv::Builder::addInstruction(this_00,IVar10,OpInBoundsAccessChain);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = local_84;
      iVar6._M_current =
           (pIVar14->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar14->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar14->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current = local_84;
        (pIVar14->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar12->resultId;
      iVar6._M_current =
           (pIVar14->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar14->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar14->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar14->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      pIVar12 = spv::Builder::addInstruction(this_00,OpStore);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar14->resultId;
      iVar6._M_current =
           (pIVar12->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar12->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar12->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar15->resultId;
      iVar6._M_current =
           (pIVar12->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar12->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar12->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      pIVar8 = local_98;
      pIVar12 = spv::Builder::addInstruction(this_00,local_74,OpULessThan);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar13->resultId;
      iVar6._M_current =
           (pIVar12->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar12->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar12->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = local_58->resultId;
      iVar6._M_current =
           (pIVar12->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar12->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar12->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      elseBlock = local_70;
      pBVar9 = local_80;
      spv::Builder::createLoopMerge(this_00,local_70,local_80,0);
      spv::Builder::createConditionalBranch(this_00,pIVar12->resultId,pBVar9,elseBlock);
      (pIVar8->builder).buildPoint = elseBlock;
      pIVar12 = spv::Builder::addInstruction(this_00,returnType,OpLoad);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = local_84;
      iVar6._M_current =
           (pIVar12->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar12->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar12->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current = local_84;
        (pIVar12->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      IVar10 = local_8c;
      pIVar13 = spv::Builder::addInstruction(this_00,returnType,OpMatrixTimesScalar);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = pIVar12->resultId;
      iVar6._M_current =
           (pIVar13->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar13->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar13->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current =
             (uint)local_b8.
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        (pIVar13->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      IVar11 = spv::Builder::makeFloat16Constant(this_00,0x5c00,false);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_b8.
                             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar11);
      iVar6._M_current =
           (pIVar13->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (pIVar13->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                   &pIVar13->operands,iVar6,(uint *)&local_b8);
      }
      else {
        *iVar6._M_current = IVar11;
        (pIVar13->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      spv::Builder::makeReturn(this_00,false,pIVar13->resultId);
      (pIVar8->builder).buildPoint = local_50;
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(returnType,IVar10);
      local_b8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(0x1e,(local_a0->functionInstruction).resultId);
      __position._M_current =
           (pIVar8->coop_mat_conv_ids).
           super__Vector_base<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pIVar8->coop_mat_conv_ids).
          super__Vector_base<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
        ::_M_realloc_insert<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>
                  (&pIVar8->coop_mat_conv_ids,__position,(CoopMatConvOp *)&local_b8);
      }
      else {
        *(pointer *)__position._M_current =
             local_b8.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
        *(pointer *)&(__position._M_current)->func_id =
             local_b8.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        ppCVar2 = &(pIVar8->coop_mat_conv_ids).
                   super__Vector_base<dxil_spv::SPIRVModule::Impl::CoopMatConvOp,_dxil_spv::ThreadLocalAllocator<dxil_spv::SPIRVModule::Impl::CoopMatConvOp>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppCVar2 = *ppCVar2 + 1;
      }
      IVar10 = (local_a0->functionInstruction).resultId;
    }
  }
  return IVar10;
}

Assistant:

spv::Id SPIRVModule::Impl::build_coop_mat_fp8_to_fp16(SPIRVModule &module, const spv::Id *ids, uint32_t id_count)
{
	if (id_count != 2)
		return 0;

	spv::Id u8_type = ids[0];
	spv::Id f16_type = ids[1];

	for (auto &ops : coop_mat_conv_ids)
		if (ops.input_type == u8_type && ops.output_type == f16_type && ops.call == HelperCall::CoopMatFP8toFP16)
			return ops.func_id;

	auto *current_build_point = builder.getBuildPoint();

	spv::Block *entry = nullptr;
	spv::Id uint_type = builder.makeUintType(32);
	spv::Id bool_type = builder.makeBoolType();

	// RADV workaround. It fails to understand coopmat passed as value.
	spv::Id u8_ptr_type = builder.makePointer(spv::StorageClassFunction, u8_type);

	auto *func = builder.makeFunctionEntry(spv::NoPrecision, f16_type,
	                                       "CoopMatFP8toFP16",
	                                       { u8_ptr_type }, {}, &entry);

	spv::Id output_id = create_variable(spv::StorageClassFunction, f16_type, "coop_output");

	auto *len = builder.addInstruction(uint_type, spv::OpCooperativeMatrixLengthKHR);
	len->addIdOperand(u8_type);

	auto *header = new spv::Block(builder.getUniqueId(), *func);
	auto *merge = new spv::Block(builder.getUniqueId(), *func);
	builder.createBranch(header);
	builder.setBuildPoint(header);
	{
		auto *phi = builder.addInstruction(uint_type, spv::OpPhi);
		auto *iter = builder.addInstruction(uint_type, spv::OpIAdd);
		iter->addIdOperand(phi->getResultId());
		iter->addIdOperand(builder.makeUintConstant(1));

		phi->addIdOperand(builder.makeUintConstant(0));
		phi->addIdOperand(entry->getId());
		phi->addIdOperand(iter->getResultId());
		phi->addIdOperand(header->getId());

		auto *input_chain = builder.addInstruction(
			builder.makePointer(spv::StorageClassFunction, builder.makeUintType(8)), spv::OpInBoundsAccessChain);
		input_chain->addIdOperand(func->getParamId(0));
		input_chain->addIdOperand(phi->getResultId());

		auto *load = builder.addInstruction(builder.makeUintType(8), spv::OpLoad);
		load->addIdOperand(input_chain->getResultId());

		auto *sext = builder.addInstruction(builder.makeIntType(16), spv::OpSConvert);
		sext->addIdOperand(load->getResultId());

		auto *shift = builder.addInstruction(builder.makeIntType(16), spv::OpShiftLeftLogical);
		shift->addIdOperand(sext->getResultId());
		shift->addIdOperand(builder.makeInt16Constant(7));

		auto *mask = builder.addInstruction(builder.makeIntType(16), spv::OpBitwiseAnd);
		mask->addIdOperand(shift->getResultId());
		mask->addIdOperand(builder.makeInt16Constant(int16_t(0xffff ^ 0x4000)));

		auto *bitcast = builder.addInstruction(builder.makeFloatType(16), spv::OpBitcast);
		bitcast->addIdOperand(mask->getResultId());

		auto *output_chain = builder.addInstruction(
			builder.makePointer(spv::StorageClassFunction, builder.makeFloatType(16)), spv::OpInBoundsAccessChain);
		output_chain->addIdOperand(output_id);
		output_chain->addIdOperand(phi->getResultId());
		auto *store = builder.addInstruction(spv::OpStore);
		store->addIdOperand(output_chain->getResultId());
		store->addIdOperand(bitcast->getResultId());

		auto *cmp = builder.addInstruction(bool_type, spv::OpULessThan);
		cmp->addIdOperand(iter->getResultId());
		cmp->addIdOperand(len->getResultId());
		builder.createLoopMerge(merge, header, 0);
		builder.createConditionalBranch(cmp->getResultId(), header, merge);
	}

	builder.setBuildPoint(merge);
	auto *loaded_result = builder.addInstruction(f16_type, spv::OpLoad);
	loaded_result->addIdOperand(output_id);

	// Need post-scale to correctly deal with denorms.
	auto *scale = builder.addInstruction(f16_type, spv::OpMatrixTimesScalar);
	scale->addIdOperand(loaded_result->getResultId());
	scale->addIdOperand(builder.makeFloat16Constant(0x5c00 /* 256.0 */));

	builder.makeReturn(false, scale->getResultId());

	builder.setBuildPoint(current_build_point);
	coop_mat_conv_ids.push_back({ u8_type, f16_type, func->getId(), HelperCall::CoopMatFP8toFP16 });
	return func->getId();
}